

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

string * image_format_to_type_abi_cxx11_(ImageFormat fmt,BaseType basetype)

{
  CompilerError *pCVar1;
  int in_EDX;
  undefined4 in_register_0000003c;
  string *this;
  allocator local_341;
  string local_340 [38];
  undefined1 local_31a;
  allocator local_319;
  string local_318 [34];
  allocator local_2f6;
  allocator local_2f5;
  allocator local_2f4;
  allocator local_2f3;
  undefined1 local_2f2;
  allocator local_2f1;
  string local_2f0 [37];
  allocator local_2cb;
  undefined1 local_2ca;
  allocator local_2c9;
  string local_2c8 [37];
  allocator local_2a3;
  undefined1 local_2a2;
  allocator local_2a1;
  string local_2a0 [37];
  allocator local_27b;
  undefined1 local_27a;
  allocator local_279;
  string local_278 [37];
  allocator local_253;
  undefined1 local_252;
  allocator local_251;
  string local_250 [37];
  allocator local_22b;
  undefined1 local_22a;
  allocator local_229;
  string local_228 [37];
  allocator local_203;
  undefined1 local_202;
  allocator local_201;
  string local_200 [37];
  allocator local_1db;
  undefined1 local_1da;
  allocator local_1d9;
  string local_1d8 [37];
  allocator local_1b3;
  undefined1 local_1b2;
  allocator local_1b1;
  string local_1b0 [37];
  allocator local_18b;
  undefined1 local_18a;
  allocator local_189;
  string local_188 [37];
  allocator local_163;
  undefined1 local_162;
  allocator local_161;
  string local_160 [37];
  allocator local_13b;
  undefined1 local_13a;
  allocator local_139;
  string local_138 [37];
  allocator local_113;
  undefined1 local_112;
  allocator local_111;
  string local_110 [37];
  allocator local_eb;
  undefined1 local_ea;
  allocator local_e9;
  string local_e8 [37];
  allocator local_c3;
  undefined1 local_c2;
  allocator local_c1;
  string local_c0 [37];
  allocator local_9b;
  undefined1 local_9a;
  allocator local_99;
  string local_98 [37];
  allocator local_73;
  undefined1 local_72;
  allocator local_71;
  string local_70 [34];
  allocator local_4e;
  undefined1 local_4d;
  allocator local_39;
  string local_38 [36];
  BaseType local_14;
  BaseType basetype_local;
  ImageFormat fmt_local;
  
  this = (string *)CONCAT44(in_register_0000003c,fmt);
  local_14 = basetype;
  _basetype_local = this;
  switch(basetype) {
  case Unknown:
    if (in_EDX == 7) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(this,"int4",&local_2f5);
      std::allocator<char>::~allocator((allocator<char> *)&local_2f5);
    }
    else if (in_EDX == 8) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(this,"uint4",&local_2f6);
      std::allocator<char>::~allocator((allocator<char> *)&local_2f6);
    }
    else {
      if (in_EDX != 0xd) {
        local_31a = 1;
        pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_318,"Unsupported base type for image.",&local_319);
        spirv_cross::CompilerError::CompilerError(pCVar1,(string *)local_318);
        local_31a = 0;
        __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,
                    spirv_cross::CompilerError::~CompilerError);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(this,"float4",&local_2f4);
      std::allocator<char>::~allocator((allocator<char> *)&local_2f4);
    }
    break;
  case Void:
  case Boolean:
    if (in_EDX != 0xd) {
      local_1b2 = 1;
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1b0,"Mismatch in image type and base type of image.",&local_1b1);
      spirv_cross::CompilerError::CompilerError(pCVar1,(string *)local_1b0);
      local_1b2 = 0;
      __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,
                  spirv_cross::CompilerError::~CompilerError);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"float4",&local_1b3);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b3);
    break;
  case SByte:
  case Int64:
    if (in_EDX != 0xd) {
      local_162 = 1;
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_160,"Mismatch in image type and base type of image.",&local_161);
      spirv_cross::CompilerError::CompilerError(pCVar1,(string *)local_160);
      local_162 = 0;
      __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,
                  spirv_cross::CompilerError::~CompilerError);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"float",&local_163);
    std::allocator<char>::~allocator((allocator<char> *)&local_163);
    break;
  case UByte:
  case UInt64:
    if (in_EDX != 0xd) {
      local_9a = 1;
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_98,"Mismatch in image type and base type of image.",&local_99);
      spirv_cross::CompilerError::CompilerError(pCVar1,(string *)local_98);
      local_9a = 0;
      __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,
                  spirv_cross::CompilerError::~CompilerError);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"unorm float4",&local_9b);
    std::allocator<char>::~allocator((allocator<char> *)&local_9b);
    break;
  case Short:
  case Image:
    if (in_EDX != 0xd) {
      local_13a = 1;
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_138,"Mismatch in image type and base type of image.",&local_139);
      spirv_cross::CompilerError::CompilerError(pCVar1,(string *)local_138);
      local_13a = 0;
      __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,
                  spirv_cross::CompilerError::~CompilerError);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"snorm float4",&local_13b);
    std::allocator<char>::~allocator((allocator<char> *)&local_13b);
    break;
  case UShort:
  case Int:
    if (in_EDX != 0xd) {
      local_18a = 1;
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_188,"Mismatch in image type and base type of image.",&local_189);
      spirv_cross::CompilerError::CompilerError(pCVar1,(string *)local_188);
      local_18a = 0;
      __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,
                  spirv_cross::CompilerError::~CompilerError);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"float2",&local_18b);
    std::allocator<char>::~allocator((allocator<char> *)&local_18b);
    break;
  case UInt:
    if (in_EDX != 0xd) {
      local_1da = 1;
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1d8,"Mismatch in image type and base type of image.",&local_1d9);
      spirv_cross::CompilerError::CompilerError(pCVar1,(string *)local_1d8);
      local_1da = 0;
      __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,
                  spirv_cross::CompilerError::~CompilerError);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"float3",&local_1db);
    std::allocator<char>::~allocator((allocator<char> *)&local_1db);
    break;
  case AtomicCounter:
    if (in_EDX != 0xd) {
      local_c2 = 1;
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_c0,"Mismatch in image type and base type of image.",&local_c1);
      spirv_cross::CompilerError::CompilerError(pCVar1,(string *)local_c0);
      local_c2 = 0;
      __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,
                  spirv_cross::CompilerError::~CompilerError);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"unorm float4",&local_c3);
    std::allocator<char>::~allocator((allocator<char> *)&local_c3);
    break;
  case Half:
  case Float:
    if (in_EDX != 0xd) {
      local_72 = 1;
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_70,"Mismatch in image type and base type of image.",&local_71);
      spirv_cross::CompilerError::CompilerError(pCVar1,(string *)local_70);
      local_72 = 0;
      __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,
                  spirv_cross::CompilerError::~CompilerError);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"unorm float2",&local_73);
    std::allocator<char>::~allocator((allocator<char> *)&local_73);
    break;
  case Double:
  case Struct:
    if (in_EDX != 0xd) {
      local_4d = 1;
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_38,"Mismatch in image type and base type of image.",&local_39);
      spirv_cross::CompilerError::CompilerError(pCVar1,(string *)local_38);
      local_4d = 0;
      __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,
                  spirv_cross::CompilerError::~CompilerError);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"unorm float",&local_4e);
    std::allocator<char>::~allocator((allocator<char> *)&local_4e);
    break;
  case SampledImage:
  case Sampler:
    if (in_EDX != 0xd) {
      local_112 = 1;
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_110,"Mismatch in image type and base type of image.",&local_111);
      spirv_cross::CompilerError::CompilerError(pCVar1,(string *)local_110);
      local_112 = 0;
      __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,
                  spirv_cross::CompilerError::~CompilerError);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"snorm float2",&local_113);
    std::allocator<char>::~allocator((allocator<char> *)&local_113);
    break;
  case AccelerationStructure:
  case RayQuery:
    if (in_EDX != 0xd) {
      local_ea = 1;
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_e8,"Mismatch in image type and base type of image.",&local_e9);
      spirv_cross::CompilerError::CompilerError(pCVar1,(string *)local_e8);
      local_ea = 0;
      __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,
                  spirv_cross::CompilerError::~CompilerError);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"snorm float",&local_eb);
    std::allocator<char>::~allocator((allocator<char> *)&local_eb);
    break;
  case ControlPointArray:
  case Interpolant:
  case Char:
    if (in_EDX != 7) {
      local_252 = 1;
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_250,"Mismatch in image type and base type of image.",&local_251);
      spirv_cross::CompilerError::CompilerError(pCVar1,(string *)local_250);
      local_252 = 0;
      __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,
                  spirv_cross::CompilerError::~CompilerError);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"int4",&local_253);
    std::allocator<char>::~allocator((allocator<char> *)&local_253);
    break;
  case Image|UInt:
  case Image|Half:
  case Image|Float:
    if (in_EDX != 7) {
      local_202 = 1;
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_200,"Mismatch in image type and base type of image.",&local_201);
      spirv_cross::CompilerError::CompilerError(pCVar1,(string *)local_200);
      local_202 = 0;
      __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,
                  spirv_cross::CompilerError::~CompilerError);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"int",&local_203);
    std::allocator<char>::~allocator((allocator<char> *)&local_203);
    break;
  case Image|Int64:
  case Image|UInt64:
  case Image|AtomicCounter:
    if (in_EDX != 7) {
      local_22a = 1;
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_228,"Mismatch in image type and base type of image.",&local_229);
      spirv_cross::CompilerError::CompilerError(pCVar1,(string *)local_228);
      local_22a = 0;
      __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,
                  spirv_cross::CompilerError::~CompilerError);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"int2",&local_22b);
    std::allocator<char>::~allocator((allocator<char> *)&local_22b);
    break;
  case Image|Double:
  case Image|Struct:
  case 0x20:
    if (in_EDX != 8) {
      local_2ca = 1;
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2c8,"Mismatch in image type and base type of image.",&local_2c9);
      spirv_cross::CompilerError::CompilerError(pCVar1,(string *)local_2c8);
      local_2ca = 0;
      __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,
                  spirv_cross::CompilerError::~CompilerError);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"uint4",&local_2cb);
    std::allocator<char>::~allocator((allocator<char> *)&local_2cb);
    break;
  case 0x21:
  case 0x26:
  case 0x27:
    if (in_EDX != 8) {
      local_27a = 1;
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_278,"Mismatch in image type and base type of image.",&local_279);
      spirv_cross::CompilerError::CompilerError(pCVar1,(string *)local_278);
      local_27a = 0;
      __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,
                  spirv_cross::CompilerError::~CompilerError);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"uint",&local_27b);
    std::allocator<char>::~allocator((allocator<char> *)&local_27b);
    break;
  case 0x22:
    if (in_EDX != 8) {
      local_2f2 = 1;
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2f0,"Mismatch in image type and base type of image.",&local_2f1);
      spirv_cross::CompilerError::CompilerError(pCVar1,(string *)local_2f0);
      local_2f2 = 0;
      __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,
                  spirv_cross::CompilerError::~CompilerError);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"uint4",&local_2f3);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f3);
    break;
  case 0x23:
  case 0x24:
  case 0x25:
    if (in_EDX != 8) {
      local_2a2 = 1;
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2a0,"Mismatch in image type and base type of image.",&local_2a1);
      spirv_cross::CompilerError::CompilerError(pCVar1,(string *)local_2a0);
      local_2a2 = 0;
      __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,
                  spirv_cross::CompilerError::~CompilerError);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"uint2",&local_2a3);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a3);
    break;
  default:
    pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_340,"Unrecognized typed image format.",&local_341);
    spirv_cross::CompilerError::CompilerError(pCVar1,(string *)local_340);
    __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,
                spirv_cross::CompilerError::~CompilerError);
  }
  return this;
}

Assistant:

static string image_format_to_type(ImageFormat fmt, SPIRType::BaseType basetype)
{
	switch (fmt)
	{
	case ImageFormatR8:
	case ImageFormatR16:
		if (basetype != SPIRType::Float)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "unorm float";
	case ImageFormatRg8:
	case ImageFormatRg16:
		if (basetype != SPIRType::Float)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "unorm float2";
	case ImageFormatRgba8:
	case ImageFormatRgba16:
		if (basetype != SPIRType::Float)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "unorm float4";
	case ImageFormatRgb10A2:
		if (basetype != SPIRType::Float)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "unorm float4";

	case ImageFormatR8Snorm:
	case ImageFormatR16Snorm:
		if (basetype != SPIRType::Float)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "snorm float";
	case ImageFormatRg8Snorm:
	case ImageFormatRg16Snorm:
		if (basetype != SPIRType::Float)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "snorm float2";
	case ImageFormatRgba8Snorm:
	case ImageFormatRgba16Snorm:
		if (basetype != SPIRType::Float)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "snorm float4";

	case ImageFormatR16f:
	case ImageFormatR32f:
		if (basetype != SPIRType::Float)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "float";
	case ImageFormatRg16f:
	case ImageFormatRg32f:
		if (basetype != SPIRType::Float)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "float2";
	case ImageFormatRgba16f:
	case ImageFormatRgba32f:
		if (basetype != SPIRType::Float)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "float4";

	case ImageFormatR11fG11fB10f:
		if (basetype != SPIRType::Float)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "float3";

	case ImageFormatR8i:
	case ImageFormatR16i:
	case ImageFormatR32i:
		if (basetype != SPIRType::Int)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "int";
	case ImageFormatRg8i:
	case ImageFormatRg16i:
	case ImageFormatRg32i:
		if (basetype != SPIRType::Int)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "int2";
	case ImageFormatRgba8i:
	case ImageFormatRgba16i:
	case ImageFormatRgba32i:
		if (basetype != SPIRType::Int)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "int4";

	case ImageFormatR8ui:
	case ImageFormatR16ui:
	case ImageFormatR32ui:
		if (basetype != SPIRType::UInt)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "uint";
	case ImageFormatRg8ui:
	case ImageFormatRg16ui:
	case ImageFormatRg32ui:
		if (basetype != SPIRType::UInt)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "uint2";
	case ImageFormatRgba8ui:
	case ImageFormatRgba16ui:
	case ImageFormatRgba32ui:
		if (basetype != SPIRType::UInt)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "uint4";
	case ImageFormatRgb10a2ui:
		if (basetype != SPIRType::UInt)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "uint4";

	case ImageFormatUnknown:
		switch (basetype)
		{
		case SPIRType::Float:
			return "float4";
		case SPIRType::Int:
			return "int4";
		case SPIRType::UInt:
			return "uint4";
		default:
			SPIRV_CROSS_THROW("Unsupported base type for image.");
		}

	default:
		SPIRV_CROSS_THROW("Unrecognized typed image format.");
	}
}